

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M680XDisassembler.c
# Opt level: O0

void relative16_hdlr(MCInst *MI,m680x_info *info,uint16_t *address)

{
  uint16_t *in_RDX;
  MCInst *in_RSI;
  long in_RDI;
  uint16_t offset;
  uint16_t local_1a;
  
  local_1a = 0;
  read_word((m680x_info *)in_RSI,&local_1a,*in_RDX);
  *in_RDX = *in_RDX + 2;
  add_rel_operand((m680x_info *)in_RSI,local_1a,*in_RDX + local_1a);
  add_insn_group(*(cs_detail **)(*(long *)(in_RDI + 0x310) + 0xf0),M680X_GRP_BRAREL);
  if (((in_RSI->Operands[0xe].field_2.RegVal != 0xb9) &&
      (in_RSI->Operands[0xe].field_2.RegVal != 0xbb)) &&
     (in_RSI->Operands[0xe].field_2.RegVal != 0xba)) {
    add_reg_to_rw_list(in_RSI,(m680x_reg)((ulong)in_RDX >> 0x20),(e_access)in_RDX);
  }
  return;
}

Assistant:

static void relative16_hdlr(MCInst *MI, m680x_info *info, uint16_t *address)
{
	uint16_t offset = 0;

	read_word(info, &offset, *address);
	*address += 2;
	add_rel_operand(info, (int16_t)offset, *address + offset);
	add_insn_group(MI->flat_insn->detail, M680X_GRP_BRAREL);

	if ((info->insn != M680X_INS_LBRA) &&
		(info->insn != M680X_INS_LBSR) &&
		(info->insn != M680X_INS_LBRN))
		add_reg_to_rw_list(MI, M680X_REG_CC, READ);
}